

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int fits_get_url(fitsfile *fptr,char *realURL,char *startURL,char *realAccess,char *startAccess,
                int *iostate,int *status)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *local_18b0;
  char *tmpPtr;
  char tmpStr4 [1025];
  char local_1498 [8];
  char tmpStr3 [1025];
  char local_1088 [8];
  char tmpStr2 [1025];
  char local_c78 [8];
  char tmpStr1 [1025];
  char local_868 [8];
  char outfile [1025];
  char local_458 [8];
  char infile [1025];
  int local_48;
  int local_44;
  int tmpIOstate;
  int i;
  int *iostate_local;
  char *startAccess_local;
  char *realAccess_local;
  char *startURL_local;
  char *realURL_local;
  fitsfile *fptr_local;
  
  local_48 = 0;
  if (*status == 0) {
    tmpPtr._0_1_ = '\0';
    local_1498[0] = '\0';
    local_1088[0] = '\0';
    local_c78[0] = '\0';
    iVar1 = ffflnm(fptr,local_c78,status);
    *status = iVar1;
    iVar1 = ffiurl(local_c78,(char *)0x0,local_458,local_868,(char *)0x0,local_1088,local_1498,
                   (char *)&tmpPtr,status);
    *status = iVar1;
    if (((local_1088[0] != '\0') || (local_1498[0] != '\0')) || ((char)tmpPtr != '\0')) {
      local_48 = -1;
    }
    iVar1 = ffurlt(fptr,local_1498,status);
    *status = iVar1;
    strcpy((char *)&tmpPtr,local_1498);
    iVar1 = ffrtnm(local_c78,local_1088,status);
    *status = iVar1;
    strcpy(local_c78,local_1088);
    iVar1 = fits_strcasecmp(local_1498,"file://");
    if (iVar1 == 0) {
      local_48 = 1;
      sVar2 = strlen(local_868);
      if (sVar2 == 0) {
        local_1088[0] = '\0';
      }
      else {
        strcpy(local_c78,local_868);
      }
      pcVar3 = strstr(local_c78,"://");
      if (pcVar3 != (char *)0x0) {
        strcpy(local_458,pcVar3 + 3);
        strcpy(local_c78,local_458);
      }
      pcVar3 = strstr(local_1088,"://");
      if (pcVar3 != (char *)0x0) {
        strcpy(local_458,pcVar3 + 3);
        strcpy(local_1088,local_458);
      }
    }
    else {
      iVar1 = fits_strcasecmp(local_1498,"mem://");
      if (iVar1 == 0) {
        if (local_48 < 0) {
          ffpmsg("cannot make URL from temp MEM:// file (fits_get_url)");
          *status = 0x7d;
        }
        else {
          local_48 = 1;
          local_1088[0] = '\0';
        }
      }
      else {
        iVar1 = fits_strcasecmp(local_1498,"memkeep://");
        if (iVar1 == 0) {
          strcpy(local_1498,"mem://");
          tmpPtr._0_1_ = '\0';
          local_1088[0] = '\0';
          local_48 = 1;
        }
        else {
          iVar1 = fits_strcasecmp(local_1498,"shmem://");
          if (iVar1 == 0) {
            tmpPtr._0_1_ = '\0';
            local_1088[0] = '\0';
            local_48 = 1;
          }
          else {
            iVar1 = fits_strcasecmp(local_1498,"root://");
            if (iVar1 == 0) {
              tmpPtr._0_1_ = '\0';
              local_1088[0] = '\0';
              local_48 = 1;
            }
            else {
              iVar1 = fits_strcasecmp(local_1498,"compressfile://");
              if (iVar1 == 0) {
                strcpy(local_c78,local_868);
                strcpy(local_1088,local_458);
                strcpy(local_1498,"file://");
                strcpy((char *)&tmpPtr,"file://");
                local_48 = 1;
              }
              else {
                iVar1 = fits_strcasecmp(local_1498,"httpfile://");
                if (iVar1 == 0) {
                  strcpy(local_c78,local_868);
                  strcpy(local_1498,"file://");
                  strcpy((char *)&tmpPtr,"http://");
                  local_48 = 1;
                }
                else {
                  iVar1 = fits_strcasecmp(local_1498,"ftpfile://");
                  if (iVar1 == 0) {
                    strcpy(local_c78,local_868);
                    strcpy(local_1498,"file://");
                    strcpy((char *)&tmpPtr,"ftp://");
                    local_48 = 1;
                  }
                  else {
                    iVar1 = fits_strcasecmp(local_1498,"stdinfile://");
                    if (iVar1 == 0) {
                      strcpy(local_c78,local_868);
                      strcpy(local_1498,"file://");
                      strcpy((char *)&tmpPtr,"stdin://");
                      local_48 = 1;
                    }
                    else {
                      iVar1 = fits_strcasecmp(local_1498,"compress://");
                      if (iVar1 == 0) {
                        local_c78[0] = '\0';
                        strcpy(local_1088,local_458);
                        strcpy(local_1498,"mem://");
                        strcpy((char *)&tmpPtr,"file://");
                        local_48 = 0;
                      }
                      else {
                        iVar1 = fits_strcasecmp(local_1498,"http://");
                        if (iVar1 == 0) {
                          local_c78[0] = '\0';
                          strcpy(local_1498,"mem://");
                          strcpy((char *)&tmpPtr,"http://");
                          local_48 = 0;
                        }
                        else {
                          iVar1 = fits_strcasecmp(local_1498,"httpcompress://");
                          if (iVar1 == 0) {
                            local_c78[0] = '\0';
                            strcpy(local_1498,"mem://");
                            strcpy((char *)&tmpPtr,"http://");
                            local_48 = 0;
                          }
                          else {
                            iVar1 = fits_strcasecmp(local_1498,"ftp://");
                            if (iVar1 == 0) {
                              local_c78[0] = '\0';
                              strcpy(local_1498,"mem://");
                              strcpy((char *)&tmpPtr,"ftp://");
                              local_48 = 0;
                            }
                            else {
                              iVar1 = fits_strcasecmp(local_1498,"ftpcompress://");
                              if (iVar1 == 0) {
                                local_c78[0] = '\0';
                                strcpy(local_1498,"mem://");
                                strcpy((char *)&tmpPtr,"ftp://");
                                local_48 = 0;
                              }
                              else {
                                iVar1 = fits_strcasecmp(local_1498,"stdin://");
                                if (iVar1 == 0) {
                                  *status = 0x7d;
                                  ffpmsg("cannot make valid URL from stdin:// (fits_get_url)");
                                  local_1088[0] = '\0';
                                  local_c78[0] = '\0';
                                }
                                else {
                                  iVar1 = fits_strcasecmp(local_1498,"stdout://");
                                  if (iVar1 == 0) {
                                    *status = 0x7d;
                                    ffpmsg("cannot make valid URL from stdout:// (fits_get_url)");
                                    local_1088[0] = '\0';
                                    local_c78[0] = '\0';
                                  }
                                  else {
                                    iVar1 = fits_strcasecmp(local_1498,"irafmem://");
                                    if (iVar1 == 0) {
                                      *status = 0x7d;
                                      ffpmsg("cannot make valid URL from irafmem:// (fits_get_url)")
                                      ;
                                      local_1088[0] = '\0';
                                      local_c78[0] = '\0';
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (*status == 0) {
      if (realURL != (char *)0x0) {
        sVar2 = strlen(local_c78);
        if (sVar2 == 0) {
          *realURL = '\0';
        }
        else {
          local_18b0 = strstr(local_c78,"://");
          if (local_18b0 == (char *)0x0) {
            local_18b0 = local_c78;
            local_44 = 0;
          }
          else {
            local_18b0 = local_18b0 + 3;
            local_44 = (int)local_18b0 - (int)local_c78;
            strncpy(realURL,local_c78,(long)local_44);
          }
          iVar1 = fits_path2url(local_18b0,0x401 - local_44,realURL + local_44,status);
          *status = iVar1;
        }
      }
      if (startURL != (char *)0x0) {
        sVar2 = strlen(local_1088);
        if (sVar2 == 0) {
          *startURL = '\0';
        }
        else {
          local_18b0 = strstr(local_1088,"://");
          if (local_18b0 == (char *)0x0) {
            local_18b0 = local_1088;
            local_44 = 0;
          }
          else {
            local_18b0 = local_18b0 + 3;
            local_44 = (int)local_18b0 - (int)local_1088;
            strncpy(startURL,local_1088,(long)local_44);
          }
          iVar1 = fits_path2url(local_18b0,0x401 - local_44,startURL + local_44,status);
          *status = iVar1;
        }
      }
      if (realAccess != (char *)0x0) {
        strcpy(realAccess,local_1498);
      }
      if (startAccess != (char *)0x0) {
        strcpy(startAccess,(char *)&tmpPtr);
      }
      if (iostate != (int *)0x0) {
        *iostate = local_48;
      }
    }
    fptr_local._4_4_ = *status;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int  fits_get_url(fitsfile *fptr,       /* I ptr to FITS file to evaluate    */
		  char     *realURL,    /* O URL of real FITS file           */
		  char     *startURL,   /* O URL of starting FITS file       */
		  char     *realAccess, /* O true access method of FITS file */
		  char     *startAccess,/* O "official" access of FITS file  */
		  int      *iostate,    /* O can this file be modified?      */
		  int      *status)
/*
  For grouping convention purposes, determine the URL of the FITS file
  associated with the fitsfile pointer fptr. The true access type (file://,
  mem://, shmem://, root://), starting "official" access type, and iostate 
  (0 ==> readonly, 1 ==> readwrite) are also returned.

  It is assumed that the url string has enough room to hold the resulting
  URL, and the the accessType string has enough room to hold the access type.
*/
{
  int i;
  int tmpIOstate = 0;

  char infile[FLEN_FILENAME];
  char outfile[FLEN_FILENAME];
  char tmpStr1[FLEN_FILENAME];
  char tmpStr2[FLEN_FILENAME];
  char tmpStr3[FLEN_FILENAME];
  char tmpStr4[FLEN_FILENAME];
  char *tmpPtr;


  if(*status != 0) return(*status);

  do
    {
      /* 
	 retrieve the member HDU's file name as opened by ffopen() 
	 and parse it into its constitutent pieces; get the currently
	 active driver token too
       */
	  
      *tmpStr1 = *tmpStr2 = *tmpStr3 = *tmpStr4 = 0;

      *status = fits_file_name(fptr,tmpStr1,status);

      *status = ffiurl(tmpStr1,NULL,infile,outfile,NULL,tmpStr2,tmpStr3,
		       tmpStr4,status);

      if((*tmpStr2) || (*tmpStr3) || (*tmpStr4)) tmpIOstate = -1;
 
      *status = ffurlt(fptr,tmpStr3,status);

      strcpy(tmpStr4,tmpStr3);

      *status = ffrtnm(tmpStr1,tmpStr2,status);
      strcpy(tmpStr1,tmpStr2);

      /*
	for grouping convention purposes (only) determine the URL of the
	actual FITS file being used for the given fptr, its true access 
	type (file://, mem://, shmem://, root://) and its iostate (0 ==>
	read only, 1 ==> readwrite)
      */

      /*
	The first set of access types are "simple" in that they do not
	use any redirection to temporary memory or outfiles
       */

      /* standard disk file driver is in use */
      
      if(fits_strcasecmp(tmpStr3,"file://")              == 0)         
	{
	  tmpIOstate = 1;
	  
	  if(strlen(outfile)) strcpy(tmpStr1,outfile);
	  else *tmpStr2 = 0;

	  /*
	    make sure no FILE:// specifier is given in the tmpStr1
	    or tmpStr2 strings; the convention calls for local files
	    to have no access specification
	  */

	  if((tmpPtr = strstr(tmpStr1,"://")) != NULL)
	    {
	      strcpy(infile,tmpPtr+3);
	      strcpy(tmpStr1,infile);
	    }

	  if((tmpPtr = strstr(tmpStr2,"://")) != NULL)
	    {
	      strcpy(infile,tmpPtr+3);
	      strcpy(tmpStr2,infile);
	    }
	}

      /* file stored in conventional memory */
	  
      else if(fits_strcasecmp(tmpStr3,"mem://")          == 0)          
	{
	  if(tmpIOstate < 0)
	    {
	      /* file is a temp mem file only */
	      ffpmsg("cannot make URL from temp MEM:// file (fits_get_url)");
	      *status = URL_PARSE_ERROR;
	    }
	  else
	    {
	      /* file is a "perminate" mem file for this process */
	      tmpIOstate = 1;
	      *tmpStr2 = 0;
	    }
	}

      /* file stored in conventional memory */
 
     else if(fits_strcasecmp(tmpStr3,"memkeep://")      == 0)      
	{
	  strcpy(tmpStr3,"mem://");
	  *tmpStr4 = 0;
	  *tmpStr2 = 0;
	  tmpIOstate = 1;
	}

      /* file residing in shared memory */

      else if(fits_strcasecmp(tmpStr3,"shmem://")        == 0)        
	{
	  *tmpStr4   = 0;
	  *tmpStr2   = 0;
	  tmpIOstate = 1;
	}
      
      /* file accessed via the ROOT network protocol */

      else if(fits_strcasecmp(tmpStr3,"root://")         == 0)         
	{
	  *tmpStr4   = 0;
	  *tmpStr2   = 0;
	  tmpIOstate = 1;
	}
  
      /*
	the next set of access types redirect the contents of the original
	file to an special outfile because the original could not be
	directly modified (i.e., resides on the network, was compressed).
	In these cases the URL string takes on the value of the OUTFILE,
	the access type becomes file://, and the iostate is set to 1 (can
	read/write to the file).
      */

      /* compressed file uncompressed and written to disk */

      else if(fits_strcasecmp(tmpStr3,"compressfile://") == 0) 
	{
	  strcpy(tmpStr1,outfile);
	  strcpy(tmpStr2,infile);
	  strcpy(tmpStr3,"file://");
	  strcpy(tmpStr4,"file://");
	  tmpIOstate = 1;
	}

      /* HTTP accessed file written locally to disk */

      else if(fits_strcasecmp(tmpStr3,"httpfile://")     == 0)     
	{
	  strcpy(tmpStr1,outfile);
	  strcpy(tmpStr3,"file://");
	  strcpy(tmpStr4,"http://");
	  tmpIOstate = 1;
	}
      
      /* FTP accessd file written locally to disk */

      else if(fits_strcasecmp(tmpStr3,"ftpfile://")      == 0)      
	{
	  strcpy(tmpStr1,outfile);
	  strcpy(tmpStr3,"file://");
	  strcpy(tmpStr4,"ftp://");
	  tmpIOstate = 1;
	}
      
      /* file from STDIN written to disk */

      else if(fits_strcasecmp(tmpStr3,"stdinfile://")    == 0)    
	{
	  strcpy(tmpStr1,outfile);
	  strcpy(tmpStr3,"file://");
	  strcpy(tmpStr4,"stdin://");
	  tmpIOstate = 1;
	}

      /* 
	 the following access types use memory resident files as temporary
	 storage; they cannot be modified or be made group members for 
	 grouping conventions purposes, but their original files can be.
	 Thus, their tmpStr3s are reset to mem://, their iostate
	 values are set to 0 (for no-modification), and their URL string
	 values remain set to their original values
       */

      /* compressed disk file uncompressed into memory */

      else if(fits_strcasecmp(tmpStr3,"compress://")     == 0)     
	{
	  *tmpStr1 = 0;
	  strcpy(tmpStr2,infile);
	  strcpy(tmpStr3,"mem://");
	  strcpy(tmpStr4,"file://");
	  tmpIOstate = 0;
	}
      
      /* HTTP accessed file transferred into memory */

      else if(fits_strcasecmp(tmpStr3,"http://")         == 0)         
	{
	  *tmpStr1 = 0;
	  strcpy(tmpStr3,"mem://");
	  strcpy(tmpStr4,"http://");
	  tmpIOstate = 0;
	}
      
      /* HTTP accessed compressed file transferred into memory */

      else if(fits_strcasecmp(tmpStr3,"httpcompress://") == 0) 
	{
	  *tmpStr1 = 0;
	  strcpy(tmpStr3,"mem://");
	  strcpy(tmpStr4,"http://");
	  tmpIOstate = 0;
	}
      
      /* FTP accessed file transferred into memory */
      
      else if(fits_strcasecmp(tmpStr3,"ftp://")          == 0)          
	{
	  *tmpStr1 = 0;
	  strcpy(tmpStr3,"mem://");
	  strcpy(tmpStr4,"ftp://");
	  tmpIOstate = 0;
	}
      
      /* FTP accessed compressed file transferred into memory */

      else if(fits_strcasecmp(tmpStr3,"ftpcompress://")  == 0)  
	{
	  *tmpStr1 = 0;
	  strcpy(tmpStr3,"mem://");
	  strcpy(tmpStr4,"ftp://");
	  tmpIOstate = 0;
	}	
      
      /*
	The last set of access types cannot be used to make a meaningful URL 
	strings from; thus an error is generated
       */

      else if(fits_strcasecmp(tmpStr3,"stdin://")        == 0)        
	{
	  *status = URL_PARSE_ERROR;
	  ffpmsg("cannot make valid URL from stdin:// (fits_get_url)");
	  *tmpStr1 = *tmpStr2 = 0;
	}

      else if(fits_strcasecmp(tmpStr3,"stdout://")       == 0)       
	{
	  *status = URL_PARSE_ERROR;
	  ffpmsg("cannot make valid URL from stdout:// (fits_get_url)");
	  *tmpStr1 = *tmpStr2 = 0;
	}

      else if(fits_strcasecmp(tmpStr3,"irafmem://")      == 0)      
	{
	  *status = URL_PARSE_ERROR;
	  ffpmsg("cannot make valid URL from irafmem:// (fits_get_url)");
	  *tmpStr1 = *tmpStr2 = 0;
	}

      if(*status != 0) continue;

      /*
	 assign values to the calling parameters if they are non-NULL
      */

      if(realURL != NULL)
	{
	  if(strlen(tmpStr1) == 0)
	    *realURL = 0;
	  else
	    {
	      if((tmpPtr = strstr(tmpStr1,"://")) != NULL)
		{
		  tmpPtr += 3;
		  i = (long)tmpPtr - (long)tmpStr1;
		  strncpy(realURL,tmpStr1,i);
		}
	      else
		{
		  tmpPtr = tmpStr1;
		  i = 0;
		}

	      *status = fits_path2url(tmpPtr,FLEN_FILENAME-i,realURL+i,status);
	    }
	}

      if(startURL != NULL)
	{
	  if(strlen(tmpStr2) == 0)
	    *startURL = 0;
	  else
	    {
	      if((tmpPtr = strstr(tmpStr2,"://")) != NULL)
		{
		  tmpPtr += 3;
		  i = (long)tmpPtr - (long)tmpStr2;
		  strncpy(startURL,tmpStr2,i);
		}
	      else
		{
		  tmpPtr = tmpStr2;
		  i = 0;
		}

	      *status = fits_path2url(tmpPtr,FLEN_FILENAME-i,startURL+i,status);
	    }
	}

      if(realAccess  != NULL)  strcpy(realAccess,tmpStr3);
      if(startAccess != NULL)  strcpy(startAccess,tmpStr4);
      if(iostate     != NULL) *iostate = tmpIOstate;

    }while(0);

  return(*status);
}